

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O3

void __thiscall
CNNTest_TestVaryingStridesVaryingDimImages_Test::TestBody
          (CNNTest_TestVaryingStridesVaryingDimImages_Test *this)

{
  long lVar1;
  undefined8 *puVar2;
  float *pfVar3;
  byte bVar4;
  float bias [1];
  CNN_THREAD_DATA thread_data;
  float expected_2 [12];
  float expected_1 [12];
  float expected_4 [16];
  float expected_3 [18];
  float weights [44];
  float input [408];
  float local_26cc;
  CNN_THREAD_DATA local_26c8;
  float local_26b8 [60];
  float local_25c8 [44];
  float local_2518 [410];
  CNN_CONFIG local_1eb0;
  
  bVar4 = 0;
  memcpy(local_25c8,&DAT_00c0ead0,0xb0);
  local_26cc = 2.0;
  memset(&local_1eb0,0,0x1e90);
  local_1eb0.num_layers = 1;
  local_1eb0.layer_config[0].in_channels = 1;
  local_1eb0.layer_config[0].filter_width = 4;
  local_1eb0.layer_config[0].filter_height = 0xb;
  local_1eb0.layer_config[0].out_channels = 1;
  local_1eb0.layer_config[0].skip_width = 7;
  local_1eb0.layer_config[0].skip_height = 6;
  local_1eb0.layer_config[0].activation = '\0';
  local_1eb0.layer_config[0].branch_combine_type = '\0';
  local_1eb0.layer_config[0].weights = local_25c8;
  local_1eb0.layer_config[0].bias = &local_26cc;
  memcpy(local_2518,&DAT_00c0eb80,0x660);
  local_26b8[0x14] = -54.0;
  local_26b8[0x15] = -14.0;
  local_26b8[0x16] = 21.0;
  local_26b8[0x17] = 121.0;
  local_26b8[0x10] = 13.0;
  local_26b8[0x11] = 83.0;
  local_26b8[0x12] = -21.0;
  local_26b8[0x13] = 53.0;
  local_26b8[0xc] = 41.0;
  local_26b8[0xd] = -26.0;
  local_26b8[0xe] = 5.0;
  local_26b8[0xf] = 76.0;
  local_26c8.num_workers = 1;
  local_26c8._4_4_ = 0;
  local_26c8.workers = (AVxWorker *)0x0;
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x11,0x18,local_2518,local_26b8 + 0xc,&local_1eb0,0x11,&local_26c8,0.0);
  local_1eb0.layer_config[0].skip_width = 6;
  local_1eb0.layer_config[0].skip_height = 7;
  local_26b8[8] = 62.0;
  local_26b8[9] = -37.0;
  local_26b8[10] = 83.0;
  local_26b8[0xb] = -3.0;
  local_26b8[4] = 72.0;
  local_26b8[5] = 127.0;
  local_26b8[6] = -21.0;
  local_26b8[7] = 103.0;
  local_26b8[0] = 21.0;
  local_26b8[1] = -50.0;
  local_26b8[2] = 41.0;
  local_26b8[3] = 20.0;
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x11,0x18,local_2518,local_26b8,&local_1eb0,0x11,&local_26c8,0.0);
  local_1eb0.layer_config[0].skip_width = 3;
  local_1eb0.layer_config[0].skip_height = 10;
  puVar2 = &DAT_00c0f240;
  pfVar3 = local_26b8 + 0x28;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pfVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pfVar3 = pfVar3 + (ulong)bVar4 * -4 + 2;
  }
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x11,0x18,local_2518,local_26b8 + 0x28,&local_1eb0,0x11,&local_26c8,0.0);
  local_1eb0.layer_config[0].skip_width = 10;
  local_1eb0.layer_config[0].skip_height = 3;
  local_26b8[0x24] = 36.0;
  local_26b8[0x25] = 19.0;
  local_26b8[0x26] = -37.0;
  local_26b8[0x27] = -45.0;
  local_26b8[0x20] = 58.0;
  local_26b8[0x21] = 85.0;
  local_26b8[0x22] = 51.0;
  local_26b8[0x23] = 66.0;
  local_26b8[0x1c] = 50.0;
  local_26b8[0x1d] = 40.0;
  local_26b8[0x1e] = 102.0;
  local_26b8[0x1f] = 81.0;
  local_26b8[0x18] = 21.0;
  local_26b8[0x19] = 49.0;
  local_26b8[0x1a] = 28.0;
  local_26b8[0x1b] = 87.0;
  anon_unknown.dwarf_68a17e::CNNTest::RunCNNTest
            (0x11,0x18,local_2518,local_26b8 + 0x18,&local_1eb0,0x11,&local_26c8,0.0);
  return;
}

Assistant:

TEST_F(CNNTest, TestVaryingStridesVaryingDimImages) {
  float weights[] = {
    1,  -5, -3, -4, -1, 1,  2,  -3, 2,  2,  -1, 1,  -5, 1,  1,
    -3, -5, 3,  1,  4,  -2, -5, -2, -3, -5, 0,  -1, -5, 2,  -2,
    -2, 1,  -2, -4, 1,  3,  -2, 2,  0,  -3, 2,  -3, -2, -3,
  };
  float bias[] = { 2 };

  CNN_CONFIG cnn_config = { 1,
                            0,
                            0,
                            0,
                            0,
                            {
                                {
                                    1,
                                    4,
                                    11,
                                    1,
                                    7,
                                    6,
                                    0,
                                    weights,
                                    bias,
                                    PADDING_SAME_ZERO,
                                    NONE,
                                    0,
                                    0,
                                    BRANCH_NO_COPY,
                                    BRANCH_NOC,
                                    {},
                                    {},
                                    0,
                                },
                            } };

  int image_height = 24;
  int image_width = 17;
  float input[] = {
    -1, -3, 4,  4,  -5, 4,  3,  -5, -1, -3, 4,  -4, 2,  -3, 3,  -5, 2,  -1, -5,
    1,  -1, 3,  1,  -3, -3, 4,  0,  2,  -3, -5, -5, -4, 0,  -5, -2, -3, -1, -2,
    2,  -5, 4,  4,  0,  -4, -3, 1,  -3, -5, -4, -4, 1,  -2, -3, 3,  -3, -3, -1,
    -5, -5, -2, 3,  1,  -1, -5, -5, 1,  -4, -2, -1, -2, -4, -4, 2,  -2, 2,  1,
    -2, -4, -1, 1,  -2, -5, 3,  -2, -1, -1, -5, -3, 1,  -2, -2, -3, -1, -2, -4,
    -2, 1,  -4, -1, 4,  3,  -4, 0,  4,  2,  2,  4,  -3, -5, 2,  2,  1,  -1, -4,
    -2, 1,  3,  2,  0,  4,  -1, -3, 2,  1,  -4, 2,  2,  -4, -2, 0,  -2, -1, 4,
    4,  2,  3,  -4, 2,  -4, -5, 4,  -1, -3, -1, 0,  -4, 1,  3,  -1, -3, -5, 3,
    -2, -4, 1,  2,  -2, -3, -3, -5, 1,  -3, -1, 0,  -1, 3,  -4, -1, -5, -5, 1,
    0,  0,  -2, -2, 2,  -2, 0,  0,  2,  0,  -3, 0,  -1, -4, -4, -1, 3,  -4, -4,
    -1, 0,  -5, -3, -2, 4,  -3, -4, -4, 0,  -5, 1,  -2, -3, -3, -4, 4,  3,  4,
    3,  3,  -1, 3,  1,  -3, -2, 3,  3,  0,  2,  -4, -3, 2,  2,  0,  -2, 4,  -2,
    2,  -2, -1, -4, -2, 2,  -4, 3,  -1, 4,  1,  1,  4,  -1, -4, -4, 1,  1,  -2,
    4,  -1, 3,  2,  -3, 4,  3,  1,  4,  0,  -4, 2,  0,  2,  4,  -2, -2, 4,  2,
    -1, -2, 1,  -3, 2,  3,  -5, -3, 4,  4,  2,  -5, -4, -5, -2, -4, 2,  0,  2,
    -5, 4,  -4, -2, -5, 2,  1,  0,  4,  1,  -2, -3, -4, -3, -4, 3,  3,  2,  0,
    -3, 1,  -5, 4,  0,  4,  -1, 3,  -5, -5, -2, -1, -1, 4,  3,  3,  4,  3,  -4,
    4,  -3, -3, -1, -4, -1, -4, -1, -2, 4,  -2, -4, 4,  4,  -3, -4, -1, 1,  2,
    -1, -2, -2, 3,  2,  2,  -3, 0,  -1, 0,  3,  2,  -5, 0,  -4, 0,  0,  2,  -4,
    -1, -1, 0,  -2, 0,  1,  0,  0,  4,  -5, -1, -5, 2,  -1, 0,  2,  -1, 1,  3,
    -3, -5, -2, -3, 4,  -2, -2, -1, -3, -4, -1, -2, -4, 1,  4,  -3, -2, -1, 3,
    -3, -2, 3,  2,  1,  -4, -3, -5, 1,
  };
  float expected_1[] = {
    41, -26, 5, 76, 13, 83, -21, 53, -54, -14, 21, 121,
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected_1, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 6;
  cnn_config.layer_config[0].skip_height = 7;

  float expected_2[] = {
    21, -50, 41, 20, 72, 127, -21, 103, 62, -37, 83, -3,
  };
  RunCNNTest(image_width, image_height, input, expected_2, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 3;
  cnn_config.layer_config[0].skip_height = 10;

  float expected_3[] = {
    -26, -21, -35, 69, 49,  4,  -51, -43, -56,
    -41, 15,  -44, 40, -62, 63, 38,  27,  47,
  };
  RunCNNTest(image_width, image_height, input, expected_3, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 10;
  cnn_config.layer_config[0].skip_height = 3;

  float expected_4[] = {
    21, 49, 28, 87, 50, 40, 102, 81, 58, 85, 51, 66, 36, 19, -37, -45,
  };

  RunCNNTest(image_width, image_height, input, expected_4, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);
}